

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int genHouseTower(PieceEnv *env,Piece *current,int depth)

{
  byte bVar1;
  Piece *pPVar2;
  Piece *pPVar3;
  ulong uVar4;
  uint px;
  PieceEnv *env_00;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  if (depth < 9) {
    bVar1 = current->rot;
    px = (uint)bVar1;
    pPVar2 = addEndCityPiece((PieceEnv *)env->list,(Piece *)env->n,(int)current,px,-3,env->y,-0xb);
    uVar4 = *env->rng;
    do {
      uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar5 = (int)(uVar4 >> 0x11);
      iVar6 = iVar5 + (int)((uVar4 >> 0x11) / 3) * -3;
    } while (-1 < (iVar6 - iVar5) + -3);
    *env->rng = uVar4;
    if (iVar6 == 0) {
      addEndCityPiece((PieceEnv *)env->list,(Piece *)env->n,(int)pPVar2,(uint)bVar1,-1,4,-1);
    }
    else {
      pPVar3 = addEndCityPiece((PieceEnv *)env->list,(Piece *)env->n,(int)pPVar2,px,-1,0,-1);
      env_00 = (PieceEnv *)env->list;
      pPVar2 = (Piece *)env->n;
      iVar5 = (int)pPVar3;
      if (iVar6 != 1) {
        pPVar3 = addEndCityPiece(env_00,pPVar2,iVar5,px,-1,4,-1);
        env_00 = (PieceEnv *)env->list;
        pPVar2 = (Piece *)env->n;
        iVar5 = (int)pPVar3;
      }
      pPVar2 = addEndCityPiece(env_00,pPVar2,iVar5,px,-1,8,-1);
      genPiecesRecusively(genTower,env,pPVar2,depth + 1);
    }
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static
int genHouseTower(PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8) return 0;
    int rot = current->rot;
    Piece *base = current;
    base = addEndCityPiece(env, base, rot, -3, env->y, -11, BASE_FLOOR);
    int size = nextInt(env->rng, 3);
    if (size == 0)
    {
        addEndCityPiece(env, base, rot, -1, 4, -1, BASE_ROOF);
        return 1;
    }
    base = addEndCityPiece(env, base, rot, -1, 0, -1, SECOND_FLOOR_2);
    if (size == 1)
    {
        base = addEndCityPiece(env, base, rot, -1, 8, -1, SECOND_ROOF);
    }
    else
    {
        base = addEndCityPiece(env, base, rot, -1, 4, -1, THIRD_FLOOR_2);
        base = addEndCityPiece(env, base, rot, -1, 8, -1, THIRD_ROOF);
    }
    genPiecesRecusively(genTower, env, base, depth+1);
    return 1;
}